

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O3

void __thiscall iqnet::Reactor<boost::mutex>::handle_user_events(Reactor<boost::mutex> *this)

{
  ushort *puVar1;
  _List_node_base *p_Var2;
  long *plVar3;
  _List_node_base *p_Var4;
  _Node *__tmp;
  long *plVar5;
  HandlerStateList called_by_user;
  scoped_lock lk;
  HandlerState hs;
  long *local_58;
  undefined1 *local_50;
  long local_48;
  unique_lock<boost::mutex> local_40;
  HandlerState local_30;
  
  local_50 = (undefined1 *)&local_58;
  local_58 = (long *)&local_58;
  local_48 = 0;
  local_40.m = &this->lock;
  local_40.is_locked = false;
  boost::unique_lock<boost::mutex>::lock(&local_40);
  for (p_Var2 = (this->handlers_states).
                super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->handlers_states; p_Var2 = p_Var2->_M_next) {
    if (*(short *)((long)&p_Var2[1]._M_next + 6) != 0) {
      p_Var4 = (_List_node_base *)operator_new(0x18);
      p_Var4[1]._M_next = p_Var2[1]._M_next;
      std::__detail::_List_node_base::_M_hook(p_Var4);
      local_48 = local_48 + 1;
      puVar1 = (ushort *)((long)&p_Var2[1]._M_next + 6);
      *puVar1 = *puVar1 & (ushort)(*(short *)((long)&p_Var2[1]._M_next + 4) == 0);
    }
  }
  boost::unique_lock<boost::mutex>::unlock(&local_40);
  if ((long **)local_58 != &local_58) {
    do {
      plVar5 = local_58;
      local_30 = *(HandlerState *)(local_58 + 2);
      local_48 = local_48 + -1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(plVar5,0x18);
      invoke_event_handler(this,&local_30);
    } while ((long **)local_58 != &local_58);
  }
  if (local_40.is_locked == true) {
    boost::mutex::unlock(local_40.m);
  }
  plVar5 = local_58;
  if ((long **)local_58 != &local_58) {
    do {
      plVar3 = (long *)*plVar5;
      operator_delete(plVar5,0x18);
      plVar5 = plVar3;
    } while ((long **)plVar3 != &local_58);
  }
  return;
}

Assistant:

void Reactor<Lock>::handle_user_events()
{
  HandlerStateList called_by_user;
  scoped_lock lk(lock);

  for( hs_iterator i = begin(); i != end(); ++i )
  {
    if( i->revents && (i->mask | i->revents) )
    {
      called_by_user.push_back( *i );
      i->revents &= !i->mask;
    }
  }

  lk.unlock();

  while( !called_by_user.empty() )
  {
    HandlerState hs(called_by_user.front());
    called_by_user.pop_front();
    invoke_event_handler(hs);
  }
}